

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

void dump_fnbody(LispPTR fnblockaddr)

{
  LispPTR LVar1;
  uint uVar2;
  int iVar3;
  fnhead *fnobj_00;
  int len;
  int word;
  int i;
  DLbyte *scratch;
  fnhead *fnobj;
  LispPTR fnblockaddr_local;
  
  fnobj_00 = (fnhead *)NativeAligned4FromLAddr(fnblockaddr);
  printf("***DUMP Func Obj << ");
  LVar1 = LAddrFromNative(fnobj_00);
  printf("start at 0x%x lisp address(%p 68k)\n",(ulong)LVar1,fnobj_00);
  print(*(uint *)&fnobj_00->field_0x8 & 0xfffffff);
  putchar(10);
  printf("stkmin    : %d\n",(ulong)fnobj_00->stkmin);
  printf("na        : %d\n",(ulong)(uint)(int)fnobj_00->na);
  printf("pv        : %d\n",(ulong)(uint)(int)fnobj_00->pv);
  printf("startpc   : %d\n",(ulong)fnobj_00->startpc);
  printf("argtype   : %d\n",(ulong)(*(uint *)&fnobj_00->field_0x8 >> 0x1c & 3));
  printf("framename : %d\n",(ulong)(*(uint *)&fnobj_00->field_0x8 & 0xfffffff));
  printf("ntsize    : %d\n",(ulong)fnobj_00->ntsize);
  printf("nlocals   : %d\n",(ulong)(*(ushort *)&fnobj_00->field_0xc >> 8));
  printf("fvaroffset: %d\n",(ulong)(*(ushort *)&fnobj_00->field_0xc & 0xff));
  for (len = 0x14; len < (int)(uint)fnobj_00->startpc; len = len + 2) {
    uVar2 = (uint)*(ushort *)((long)&fnobj_00->na + (long)len ^ 2);
    LVar1 = LAddrFromNative((void *)((long)&fnobj_00->na + (long)len));
    printf(" 0x%x(%p 68k): 0%6o  0x%4x\n",(ulong)LVar1,(long)&fnobj_00->na + (long)len,(ulong)uVar2,
           (ulong)uVar2);
  }
  _word = (DLbyte *)((long)&fnobj_00->na + (long)(int)(uint)fnobj_00->startpc);
  len = 0;
  while ((len < 2000 &&
         (iVar3 = print_opcode((uint)fnobj_00->startpc + len,_word,fnobj_00), 0 < iVar3))) {
    _word = _word + iVar3;
    len = iVar3 + len;
  }
  return;
}

Assistant:

void dump_fnbody(LispPTR fnblockaddr)
/* atom index */
{
  struct fnhead *fnobj;
  DLbyte *scratch;
  int i;

  fnobj = (struct fnhead *)NativeAligned4FromLAddr(fnblockaddr);

  printf("***DUMP Func Obj << ");
  printf("start at 0x%x lisp address(%p 68k)\n", LAddrFromNative(fnobj), (void *)fnobj);

  print(fnobj->framename);
  putchar('\n');

  printf("stkmin    : %d\n", fnobj->stkmin);
  printf("na        : %d\n", fnobj->na);
  printf("pv        : %d\n", fnobj->pv);
  printf("startpc   : %d\n", fnobj->startpc);
  printf("argtype   : %d\n", fnobj->argtype);
  printf("framename : %d\n", fnobj->framename);
  printf("ntsize    : %d\n", fnobj->ntsize);
  printf("nlocals   : %d\n", fnobj->nlocals);
  printf("fvaroffset: %d\n", fnobj->fvaroffset);

  scratch = (DLbyte *)fnobj;
  for (i = 20; i < (fnobj->startpc); i += 2) {
    int word;
    word = (int)(0xffff & (GETWORD((DLword *)(scratch + i))));
    printf(" 0x%x(%p 68k): 0%6o  0x%4x\n", LAddrFromNative(scratch + i), (void *)(scratch + i), word, word);
  }

  scratch = (DLbyte *)fnobj + (fnobj->startpc);
  for (i = 0; i < 2000; i++) {
    int len = print_opcode(fnobj->startpc + i, scratch, fnobj);
    if (len < 1) return;
    scratch += len;
    i += (len - 1);
  }

}